

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-ls.c
# Opt level: O0

void listbigfile_r(BigFile *bf,char *path)

{
  char *pcVar1;
  long lVar2;
  long lVar3;
  void *__ptr;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  undefined8 uStack_f0;
  char acStack_e8 [8];
  size_t local_e0;
  size_t local_d8;
  char *local_d0;
  char *blockname;
  char *pcStack_c0;
  int i;
  char *buf;
  undefined1 local_b0 [4];
  int n;
  stat st;
  dirent **namelist;
  char *path_local;
  BigFile *bf_local;
  
  uStack_f0 = 0x10244f;
  local_d8 = strlen(bf->basename);
  uStack_f0 = 0x10245f;
  sVar4 = strlen(path);
  lVar2 = -(local_d8 + 0x19 + sVar4 & 0xfffffffffffffff0);
  pcStack_c0 = acStack_e8 + lVar2;
  *(undefined8 *)((long)&uStack_f0 + lVar2) = 0x10248b;
  sVar4 = strlen(path);
  pcVar6 = pcStack_c0;
  if (sVar4 == 0) {
    pcVar1 = bf->basename;
    *(undefined8 *)((long)&uStack_f0 + lVar2) = 0x1024cf;
    sprintf(pcVar6,"%s",pcVar1);
  }
  else {
    pcVar1 = bf->basename;
    *(undefined8 *)((long)&uStack_f0 + lVar2) = 0x1024b1;
    sprintf(pcVar6,"%s/%s",pcVar1,path);
  }
  pcVar6 = pcStack_c0;
  *(undefined8 *)((long)&uStack_f0 + lVar2) = 0x1024e2;
  stat(pcVar6,(stat *)local_b0);
  pcVar6 = pcStack_c0;
  if (((uint)st.st_nlink & 0xf000) == 0x4000) {
    *(undefined8 *)((long)&uStack_f0 + lVar2) = 0x102517;
    buf._4_4_ = scandir(pcVar6,(dirent ***)(st.__glibc_reserved + 2),filter,alphasort);
    pcVar6 = pcStack_c0;
    if (buf._4_4_ < 0) {
      *(undefined8 *)((long)&uStack_f0 + lVar2) = 0x102545;
      fprintf(_stderr,"cannot open dir: %s\n",pcVar6);
    }
    else {
      pcVar6 = acStack_e8 + lVar2;
      for (blockname._4_4_ = 0; blockname._4_4_ < buf._4_4_; blockname._4_4_ = blockname._4_4_ + 1)
      {
        lVar2 = *(long *)(st.__glibc_reserved[2] + (long)blockname._4_4_ * 8);
        builtin_strncpy(pcVar6 + -8,"~%\x10",4);
        pcVar6[-4] = '\0';
        pcVar6[-3] = '\0';
        pcVar6[-2] = '\0';
        pcVar6[-1] = '\0';
        local_e0 = strlen((char *)(lVar2 + 0x13));
        pcVar6[-8] = -0x72;
        pcVar6[-7] = '%';
        pcVar6[-6] = '\x10';
        pcVar6[-5] = '\0';
        pcVar6[-4] = '\0';
        pcVar6[-3] = '\0';
        pcVar6[-2] = '\0';
        pcVar6[-1] = '\0';
        sVar4 = strlen(path);
        lVar2 = -(local_e0 + 0x19 + sVar4 & 0xfffffffffffffff0);
        pcVar5 = pcVar6 + lVar2;
        local_d0 = pcVar5;
        pcVar5[-8] = -0x46;
        pcVar5[-7] = '%';
        pcVar5[-6] = '\x10';
        pcVar5[-5] = '\0';
        pcVar5[-4] = '\0';
        pcVar5[-3] = '\0';
        pcVar5[-2] = '\0';
        pcVar5[-1] = '\0';
        sVar4 = strlen(path);
        pcVar1 = local_d0;
        if (sVar4 == 0) {
          lVar3 = *(long *)(st.__glibc_reserved[2] + (long)blockname._4_4_ * 8);
          builtin_strncpy(pcVar6 + lVar2 + -8,"\x16&\x10",4);
          pcVar5[-4] = '\0';
          pcVar5[-3] = '\0';
          pcVar5[-2] = '\0';
          pcVar5[-1] = '\0';
          sprintf(pcVar1,"%s",lVar3 + 0x13);
        }
        else {
          lVar3 = *(long *)(st.__glibc_reserved[2] + (long)blockname._4_4_ * 8);
          pcVar5[-8] = -0x14;
          pcVar5[-7] = '%';
          pcVar5[-6] = '\x10';
          pcVar5[-5] = '\0';
          pcVar5[-4] = '\0';
          pcVar5[-3] = '\0';
          pcVar5[-2] = '\0';
          pcVar5[-1] = '\0';
          sprintf(pcVar1,"%s/%s",path,lVar3 + 0x13);
        }
        pcVar1 = local_d0;
        builtin_strncpy(pcVar6 + lVar2 + -8,"&&\x10",4);
        pcVar5[-4] = '\0';
        pcVar5[-3] = '\0';
        pcVar5[-2] = '\0';
        pcVar5[-1] = '\0';
        listbigblock(bf,pcVar1);
        pcVar1 = local_d0;
        builtin_strncpy(pcVar6 + lVar2 + -8,"6&\x10",4);
        pcVar5[-4] = '\0';
        pcVar5[-3] = '\0';
        pcVar5[-2] = '\0';
        pcVar5[-1] = '\0';
        listbigfile_r(bf,pcVar1);
        __ptr = *(void **)(st.__glibc_reserved[2] + (long)blockname._4_4_ * 8);
        builtin_strncpy(pcVar6 + lVar2 + -8,"J&\x10",4);
        pcVar5[-4] = '\0';
        pcVar5[-3] = '\0';
        pcVar5[-2] = '\0';
        pcVar5[-1] = '\0';
        free(__ptr);
        pcVar6 = pcVar5;
      }
      builtin_strncpy(pcVar6 + -8,"g&\x10",4);
      pcVar6[-4] = '\0';
      pcVar6[-3] = '\0';
      pcVar6[-2] = '\0';
      pcVar6[-1] = '\0';
      free((void *)st.__glibc_reserved[2]);
    }
  }
  return;
}

Assistant:

static void listbigfile_r(BigFile * bf, char * path) {
    struct dirent **namelist;
    struct stat st;
    int n;
    char * buf = alloca(strlen(bf->basename) + strlen(path) + 10);
    if(strlen(path) > 0) 
        sprintf(buf, "%s/%s", bf->basename, path);
    else
        sprintf(buf, "%s", bf->basename);
    stat(buf, &st);
    if(!S_ISDIR(st.st_mode)) return;
    n = scandir(buf, &namelist, filter, alphasort);
    if (n < 0) {
        fprintf(stderr, "cannot open dir: %s\n", buf);
    } else {
        int i;
        for(i = 0; i < n ; i ++) {
            char * blockname = alloca(strlen(namelist[i]->d_name) + strlen(path) + 10);
            if(strlen(path) > 0) 
                sprintf(blockname, "%s/%s", path, namelist[i]->d_name);
            else
                sprintf(blockname, "%s", namelist[i]->d_name);
            listbigblock(bf, blockname);
            listbigfile_r(bf, blockname);
            free(namelist[i]);
        }
        free(namelist);
    }
}